

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *workspace,size_t workspaceSize)

{
  uint tableLog;
  size_t err_code;
  size_t sVar1;
  size_t sVar2;
  size_t nbSeq_1;
  short local_a8 [60];
  
  switch(type) {
  case set_basic:
    sVar2 = FSE_buildCTable_wksp(nextCTable,defaultNorm,defaultMax,defaultNormLog,workspace,0x1800);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
    break;
  case set_rle:
    sVar1 = FSE_buildCTable_rle(nextCTable,(BYTE)max);
    if (sVar1 < 0xffffffffffffff89) {
      if (dstCapacity == 0) {
        sVar1 = 0xffffffffffffffba;
      }
      else {
        *(BYTE *)dst = *codeTable;
        sVar1 = 1;
      }
    }
    break;
  case set_compressed:
    tableLog = FSE_optimalTableLog(FSELog,nbSeq,max);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      nbSeq = nbSeq - 1;
    }
    sVar1 = FSE_normalizeCount(local_a8,tableLog,count,nbSeq,max);
    if (((sVar1 < 0xffffffffffffff89) &&
        (sVar1 = FSE_writeNCount(dst,dstCapacity,local_a8,max,tableLog), sVar1 < 0xffffffffffffff89)
        ) && (sVar2 = FSE_buildCTable_wksp(nextCTable,local_a8,max,tableLog,workspace,0x1800),
             0xffffffffffffff88 < sVar2)) {
      sVar1 = sVar2;
    }
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    sVar1 = 0;
    break;
  default:
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

MEM_STATIC size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max));
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall);
        *op = codeTable[0];
        return 1;
    case set_repeat:
        memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, workspace, workspaceSize));  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        S16 norm[MaxSeq + 1];
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        FORWARD_IF_ERROR(FSE_normalizeCount(norm, tableLog, count, nbSeq_1, max));
        {   size_t const NCountSize = FSE_writeNCount(op, oend - op, norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize);
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, norm, max, tableLog, workspace, workspaceSize));
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC);
    }
}